

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Command.cpp
# Opt level: O1

int __thiscall IRCCommand::getAccessLevel(IRCCommand *this,Channel *channel)

{
  int iVar1;
  pointer pCVar2;
  pointer pTVar3;
  pointer pCVar4;
  pointer pTVar5;
  bool bVar6;
  int iVar7;
  int unaff_EBP;
  pointer pCVar8;
  pointer pTVar9;
  bool bVar10;
  basic_string_view<char,_std::char_traits<char>_> bVar11;
  basic_string_view<char,_std::char_traits<char>_> bVar12;
  
  pCVar8 = (this->m_channels).
           super__Vector_base<IRCCommand::ChannelAccessPair,_std::allocator<IRCCommand::ChannelAccessPair>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (this->m_channels).
           super__Vector_base<IRCCommand::ChannelAccessPair,_std::allocator<IRCCommand::ChannelAccessPair>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar10 = pCVar8 == pCVar2;
  if (!bVar10) {
    bVar11 = (basic_string_view<char,_std::char_traits<char>_>)
             Jupiter::IRC::Client::Channel::getName();
    bVar12._M_str = (pCVar8->channel)._M_dataplus._M_p;
    bVar12._M_len = (pCVar8->channel)._M_string_length;
    bVar6 = jessilib::equalsi<char,char>(bVar12,bVar11);
    unaff_EBP = pCVar8->access;
    if (!bVar6) {
      do {
        pCVar4 = pCVar8;
        pCVar8 = pCVar4 + 1;
        bVar10 = pCVar8 == pCVar2;
        if (bVar10) goto LAB_0010c31d;
        bVar12 = (basic_string_view<char,_std::char_traits<char>_>)
                 Jupiter::IRC::Client::Channel::getName();
        bVar11._M_str = (pCVar8->channel)._M_dataplus._M_p;
        bVar11._M_len = pCVar4[1].channel._M_string_length;
        bVar6 = jessilib::equalsi<char,char>(bVar11,bVar12);
      } while (!bVar6);
      unaff_EBP = pCVar4[1].access;
    }
  }
LAB_0010c31d:
  if (bVar10) {
    pTVar9 = (this->m_types).
             super__Vector_base<IRCCommand::TypeAccessPair,_std::allocator<IRCCommand::TypeAccessPair>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pTVar3 = (this->m_types).
             super__Vector_base<IRCCommand::TypeAccessPair,_std::allocator<IRCCommand::TypeAccessPair>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar10 = pTVar9 == pTVar3;
    if (!bVar10) {
      iVar1 = pTVar9->type;
      iVar7 = Jupiter::IRC::Client::Channel::getType();
      if (iVar1 == iVar7) {
        unaff_EBP = pTVar9->access;
      }
      else {
        do {
          pTVar5 = pTVar9;
          pTVar9 = pTVar5 + 1;
          bVar10 = pTVar9 == pTVar3;
          if (bVar10) goto LAB_0010c377;
          iVar1 = pTVar9->type;
          iVar7 = Jupiter::IRC::Client::Channel::getType();
        } while (iVar1 != iVar7);
        unaff_EBP = pTVar5[1].access;
      }
    }
LAB_0010c377:
    if (bVar10) {
      unaff_EBP = this->m_access;
    }
  }
  return unaff_EBP;
}

Assistant:

int IRCCommand::getAccessLevel(Jupiter::IRC::Client::Channel *channel) {
	for (const auto& pair : m_channels) {
		if (jessilib::equalsi(pair.channel, channel->getName())) {
			return pair.access;
		}
	}

	for (const auto& pair : m_types) {
		if (pair.type == channel->getType()) {
			return pair.access;
		}
	}

	return m_access;
}